

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::App::help(string *__return_storage_ptr__,App *this,string *prev,AppFormatMode mode)

{
  App *this_00;
  element_type *peVar1;
  string *prev_00;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (prev->_M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (prev,&this->name_);
  }
  else {
    ::std::operator+(&local_90," ",&this->name_);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (prev,&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_90,&this->parsed_subcommands_
            );
  if (local_90._M_dataplus._M_p == (pointer)local_90._M_string_length) {
    peVar1 = (this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    prev_00 = &local_70;
    ::std::__cxx11::string::string((string *)prev_00,prev);
    (*peVar1->_vptr_FormatterBase[2])(__return_storage_ptr__,peVar1,this,prev_00,(ulong)mode);
  }
  else {
    this_00 = *(App **)(local_90._M_string_length + -8);
    prev_00 = &local_50;
    ::std::__cxx11::string::string((string *)prev_00,prev);
    help(__return_storage_ptr__,this_00,prev_00,mode);
  }
  ::std::__cxx11::string::~string((string *)prev_00);
  std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base
            ((_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::string App::help(std::string prev, AppFormatMode mode) const {
    if(prev.empty())
        prev = get_name();
    else
        prev += " " + get_name();

    // Delegate to subcommand if needed
    auto selected_subcommands = get_subcommands();
    if(!selected_subcommands.empty()) {
        return selected_subcommands.back()->help(prev, mode);
    }
    return formatter_->make_help(this, prev, mode);
}